

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void multipcm_write(void *info,UINT8 offset,UINT8 data)

{
  uint local_2c;
  MultiPCM *ptChip;
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  switch(offset) {
  case '\0':
    if (*(int *)((long)info + 0x10a8) != -1) {
      write_slot((MultiPCM *)info,
                 (slot_t *)((long)info + (long)*(int *)((long)info + 0x10a8) * 0x98 + 8),
                 *(INT32 *)((long)info + 0x10ac),data);
    }
    break;
  case '\x01':
    *(INT32 *)((long)info + 0x10a8) = VALUE_TO_CHANNEL[(int)(data & 0x1f)];
    break;
  case '\x02':
    if (data < 8) {
      local_2c = (uint)data;
    }
    else {
      local_2c = 7;
    }
    *(uint *)((long)info + 0x10ac) = local_2c;
    break;
  case '\x10':
    *(undefined1 *)((long)info + 0x10b0) = 1;
    *(uint *)((long)info + 0x10b4) = (uint)data << 0x14;
    *(uint *)((long)info + 0x10b8) = (uint)data << 0x14 | 0x80000;
    break;
  case '\x11':
    *(undefined1 *)((long)info + 0x10b0) = 1;
    *(uint *)((long)info + 0x10b4) = (uint)data << 0x13;
    break;
  case '\x12':
    *(undefined1 *)((long)info + 0x10b0) = 1;
    *(uint *)((long)info + 0x10b8) = (uint)data << 0x13;
  }
  return;
}

Assistant:

static void multipcm_write(void *info, UINT8 offset, UINT8 data)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	switch(offset)
	{
		case 0:     //Data write
			if (ptChip->cur_slot == -1)
				return;
			write_slot(ptChip, ptChip->slots + ptChip->cur_slot, ptChip->address, data);
			break;
		case 1:
			ptChip->cur_slot = VALUE_TO_CHANNEL[data & 0x1f];
			break;

		case 2:
			ptChip->address = (data > 7) ? 7 : data;
			break;

		// special SEGA banking
		case 0x10:	// 1 MB banking (Sega Model 1)
			ptChip->sega_banking = 1;
			ptChip->bank0 = (data << 20) | 0x000000;
			ptChip->bank1 = (data << 20) | 0x080000;
			break;
		case 0x11:	// 512 KB banking - low bank (Sega Multi 32)
			ptChip->sega_banking = 1;
			ptChip->bank0 = data << 19;
			break;
		case 0x12:	// 512 KB banking - high bank (Sega Multi 32)
			ptChip->sega_banking = 1;
			ptChip->bank1 = data << 19;
			break;
	}
}